

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcessDiscrete.cpp
# Opt level: O2

TGet * __thiscall
MultiAgentDecisionProcessDiscrete::GetTGet(MultiAgentDecisionProcessDiscrete *this)

{
  bool bVar1;
  TGet_TransitionModelMappingSparse *this_00;
  
  bVar1 = this->_m_sparse;
  this_00 = (TGet_TransitionModelMappingSparse *)operator_new(0x20);
  if (bVar1 == true) {
    TGet_TransitionModelMappingSparse::TGet_TransitionModelMappingSparse
              (this_00,(TransitionModelMappingSparse *)this->_m_p_tModel);
  }
  else {
    TGet_TransitionModelMapping::TGet_TransitionModelMapping
              ((TGet_TransitionModelMapping *)this_00,(TransitionModelMapping *)this->_m_p_tModel);
  }
  return &this_00->super_TGet;
}

Assistant:

TGet* MultiAgentDecisionProcessDiscrete::GetTGet() const
{ 
    if(_m_sparse)
        return new TGet_TransitionModelMappingSparse(
                ((TransitionModelMappingSparse*)_m_p_tModel)  ); 
    else
        return new TGet_TransitionModelMapping(
                ((TransitionModelMapping*)_m_p_tModel)  );
}